

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O3

void __thiscall
Effects_Buffer::mix_enhanced(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short *psVar6;
  short *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  fixed_t fVar19;
  long lVar20;
  int iVar21;
  byte bVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  
  iVar29 = *(int *)&this->field_0xb4;
  iVar34 = *(int *)&this->field_0xf4;
  iVar30 = *(int *)&this->field_0x134;
  iVar26 = *(int *)&this->field_0x174;
  iVar33 = *(int *)&this->field_0x1b4;
  iVar31 = *(int *)&this->field_0x34;
  iVar27 = *(int *)&this->field_0x74;
  uVar35 = this->reverb_pos;
  uVar36 = this->echo_pos;
  if (count != 0) {
    uVar1 = *(undefined4 *)&this->field_0xb8;
    psVar6 = (this->reverb_buf).begin_;
    psVar7 = (this->echo_buf).begin_;
    lVar8 = *(long *)&this->field_0x28;
    lVar9 = *(long *)&this->field_0x68;
    lVar10 = *(long *)&this->field_0x1a8;
    lVar11 = *(long *)&this->field_0x168;
    lVar12 = *(long *)&this->field_0x128;
    lVar13 = *(long *)&this->field_0xe8;
    lVar14 = *(long *)&this->field_0xa8;
    lVar15 = (this->chans).pan_1_levels[0];
    lVar16 = (this->chans).pan_2_levels[0];
    iVar2 = (this->chans).reverb_delay_l;
    lVar17 = (this->chans).pan_1_levels[1];
    lVar18 = (this->chans).pan_2_levels[1];
    iVar3 = (this->chans).reverb_delay_r;
    fVar19 = (this->chans).reverb_level;
    lVar20 = (this->chans).echo_level;
    iVar4 = (this->chans).echo_delay_l;
    iVar5 = (this->chans).echo_delay_r;
    lVar32 = 0;
    do {
      iVar21 = iVar31 >> 0xe;
      bVar22 = (byte)uVar1;
      iVar31 = (iVar31 - (iVar31 >> (bVar22 & 0x1f))) + *(int *)(lVar8 + lVar32 * 4);
      iVar24 = iVar27 >> 0xe;
      iVar27 = (iVar27 - (iVar27 >> (bVar22 & 0x1f))) + *(int *)(lVar9 + lVar32 * 4);
      iVar25 = (int)((ulong)(lVar16 * iVar24) >> 0xf) +
               (int)((ulong)(lVar15 * iVar21) >> 0xf) + (iVar34 >> 0xe) +
               (int)psVar6[iVar2 + uVar35 & 0x3fff];
      iVar28 = iVar30 >> 0xe;
      iVar34 = (iVar34 - (iVar34 >> (bVar22 & 0x1f))) + *(int *)(lVar13 + lVar32 * 4);
      iVar30 = (iVar30 - (iVar30 >> (bVar22 & 0x1f))) + *(int *)(lVar12 + lVar32 * 4);
      iVar24 = (int)((ulong)(iVar24 * lVar18) >> 0xf) +
               (int)((ulong)(iVar21 * lVar17) >> 0xf) + iVar28 +
               (int)psVar6[iVar3 + uVar35 & 0x3fff];
      iVar28 = (int)fVar19;
      psVar6[(int)uVar35] = (short)((uint)(iVar28 * iVar25) >> 0xf);
      iVar21 = iVar29 >> 0xe;
      psVar6[(long)(int)uVar35 + 1] = (short)((uint)(iVar24 * iVar28) >> 0xf);
      iVar25 = (iVar26 >> 0xe) + iVar21 + iVar25 +
               (int)((ulong)(psVar7[iVar4 + uVar36 & 0xfff] * lVar20) >> 0xf);
      iVar24 = (iVar33 >> 0xe) + iVar21 + iVar24 +
               (int)((ulong)(psVar7[iVar5 + uVar36 & 0xfff] * lVar20) >> 0xf);
      iVar29 = (iVar29 - (iVar29 >> (bVar22 & 0x1f))) + *(int *)(lVar14 + lVar32 * 4);
      iVar26 = (iVar26 - (iVar26 >> (bVar22 & 0x1f))) + *(int *)(lVar11 + lVar32 * 4);
      iVar33 = (iVar33 - (iVar33 >> (bVar22 & 0x1f))) + *(int *)(lVar10 + lVar32 * 4);
      psVar7[(int)uVar36] = (short)iVar21;
      uVar23 = (short)(char)((uint)iVar25 >> 0x18) ^ 0x7fff;
      if ((short)(ushort)iVar25 == iVar25) {
        uVar23 = (ushort)iVar25;
      }
      out_[lVar32 * 2] = uVar23;
      uVar23 = (short)(char)((uint)iVar24 >> 0x18) ^ 0x7fff;
      if ((short)(ushort)iVar24 == iVar24) {
        uVar23 = (ushort)iVar24;
      }
      out_[lVar32 * 2 + 1] = uVar23;
      uVar35 = uVar35 + 2 & 0x3fff;
      uVar36 = uVar36 + 1 & 0xfff;
      lVar32 = lVar32 + 1;
    } while (count != (int)lVar32);
  }
  this->reverb_pos = uVar35;
  this->echo_pos = uVar36;
  *(int *)&this->field_0xf4 = iVar34;
  *(int *)&this->field_0x134 = iVar30;
  *(int *)&this->field_0x174 = iVar26;
  *(int *)&this->field_0x1b4 = iVar33;
  *(int *)&this->field_0x34 = iVar31;
  *(int *)&this->field_0x74 = iVar27;
  *(int *)&this->field_0xb4 = iVar29;
  return;
}

Assistant:

void Effects_Buffer::mix_enhanced( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [2] );
	BLIP_READER_BEGIN( center, bufs [2] );
	BLIP_READER_BEGIN( l1, bufs [3] );
	BLIP_READER_BEGIN( r1, bufs [4] );
	BLIP_READER_BEGIN( l2, bufs [5] );
	BLIP_READER_BEGIN( r2, bufs [6] );
	BLIP_READER_BEGIN( sq1, bufs [0] );
	BLIP_READER_BEGIN( sq2, bufs [1] );
	
	blip_sample_t* const reverb_buf = this->reverb_buf.begin();
	blip_sample_t* const echo_buf = this->echo_buf.begin();
	int echo_pos = this->echo_pos;
	int reverb_pos = this->reverb_pos;
	
	while ( count-- )
	{
		int sum1_s = BLIP_READER_READ( sq1 );
		int sum2_s = BLIP_READER_READ( sq2 );
		
		BLIP_READER_NEXT( sq1, bass );
		BLIP_READER_NEXT( sq2, bass );
		
		int new_reverb_l = FMUL( sum1_s, chans.pan_1_levels [0] ) +
				FMUL( sum2_s, chans.pan_2_levels [0] ) + BLIP_READER_READ( l1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_l) & reverb_mask];
		
		int new_reverb_r = FMUL( sum1_s, chans.pan_1_levels [1] ) +
				FMUL( sum2_s, chans.pan_2_levels [1] ) + BLIP_READER_READ( r1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_r) & reverb_mask];
		
		BLIP_READER_NEXT( l1, bass );
		BLIP_READER_NEXT( r1, bass );
		
		fixed_t reverb_level = chans.reverb_level;
		reverb_buf [reverb_pos] = (blip_sample_t) FMUL( new_reverb_l, reverb_level );
		reverb_buf [reverb_pos + 1] = (blip_sample_t) FMUL( new_reverb_r, reverb_level );
		reverb_pos = (reverb_pos + 2) & reverb_mask;
		
		int sum3_s = BLIP_READER_READ( center );
		BLIP_READER_NEXT( center, bass );
		
		int left = new_reverb_l + sum3_s + BLIP_READER_READ( l2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_l) & echo_mask] );
		int right = new_reverb_r + sum3_s + BLIP_READER_READ( r2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_r) & echo_mask] );
		
		BLIP_READER_NEXT( l2, bass );
		BLIP_READER_NEXT( r2, bass );
		
		echo_buf [echo_pos] = sum3_s;
		echo_pos = (echo_pos + 1) & echo_mask;
		
		if ( (BOOST::int16_t) left != left )
			left = 0x7FFF - (left >> 24);
		
		out [0] = left;
		out [1] = right;
		
		out += 2;
		
		if ( (BOOST::int16_t) right != right )
			out [-1] = 0x7FFF - (right >> 24);
	}
	this->reverb_pos = reverb_pos;
	this->echo_pos = echo_pos;
	
	BLIP_READER_END( l1, bufs [3] );
	BLIP_READER_END( r1, bufs [4] );
	BLIP_READER_END( l2, bufs [5] );
	BLIP_READER_END( r2, bufs [6] );
	BLIP_READER_END( sq1, bufs [0] );
	BLIP_READER_END( sq2, bufs [1] );
	BLIP_READER_END( center, bufs [2] );
}